

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_key_derivation_key_agreement
          (psa_key_derivation_operation_t *operation,psa_key_derivation_step_t step,
          psa_key_handle_t private_key,uint8_t *peer_key,size_t peer_key_length)

{
  psa_key_slot_t *ppStack_38;
  psa_status_t status;
  psa_key_slot_t *slot;
  size_t peer_key_length_local;
  uint8_t *peer_key_local;
  psa_key_handle_t private_key_local;
  psa_key_derivation_operation_t *ppStack_18;
  psa_key_derivation_step_t step_local;
  psa_key_derivation_operation_t *operation_local;
  
  if ((operation->alg & 0x7f000000) == 0x30000000) {
    slot = (psa_key_slot_t *)peer_key_length;
    peer_key_length_local = (size_t)peer_key;
    peer_key_local._4_2_ = private_key;
    peer_key_local._6_2_ = step;
    ppStack_18 = operation;
    operation_local._4_4_ =
         psa_get_key_from_slot(private_key,&stack0xffffffffffffffc8,0x1000,operation->alg);
    if ((operation_local._4_4_ == 0) &&
       (operation_local._4_4_ =
             psa_key_agreement_internal
                       (ppStack_18,peer_key_local._6_2_,ppStack_38,(uint8_t *)peer_key_length_local,
                        (size_t)slot), operation_local._4_4_ != 0)) {
      psa_key_derivation_abort(ppStack_18);
    }
  }
  else {
    operation_local._4_4_ = -0x87;
  }
  return operation_local._4_4_;
}

Assistant:

psa_status_t psa_key_derivation_key_agreement( psa_key_derivation_operation_t *operation,
                                               psa_key_derivation_step_t step,
                                               psa_key_handle_t private_key,
                                               const uint8_t *peer_key,
                                               size_t peer_key_length )
{
    psa_key_slot_t *slot;
    psa_status_t status;
    if( ! PSA_ALG_IS_KEY_AGREEMENT( operation->alg ) )
        return( PSA_ERROR_INVALID_ARGUMENT );
    status = psa_get_transparent_key( private_key, &slot,
                                      PSA_KEY_USAGE_DERIVE, operation->alg );
    if( status != PSA_SUCCESS )
        return( status );
    status = psa_key_agreement_internal( operation, step,
                                         slot,
                                         peer_key, peer_key_length );
    if( status != PSA_SUCCESS )
        psa_key_derivation_abort( operation );
    return( status );
}